

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

bool __thiscall FOptionMenuItemCommand::Activate(FOptionMenuItemCommand *this)

{
  char *cmd;
  float volume;
  FSoundID local_14;
  FOptionMenuItemCommand *local_10;
  FOptionMenuItemCommand *this_local;
  
  local_10 = this;
  FSoundID::FSoundID(&local_14,"menu/choose");
  volume = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
  S_Sound(0x22,&local_14,volume,0.0);
  cmd = FName::operator_cast_to_char_
                  (&(this->super_FOptionMenuItemSubmenu).super_FOptionMenuItem.super_FListMenuItem.
                    mAction);
  C_DoCommand(cmd,0);
  return true;
}

Assistant:

bool Activate()
	{
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/choose", snd_menuvolume, ATTN_NONE);
		C_DoCommand(mAction);
		return true;
	}